

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_func_call_arg_abi_cxx11_(CompilerMSL *this,Parameter *arg,uint32_t id)

{
  MSLFormatResolution MVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  TypedID<(spirv_cross::Types)0> *__last;
  Variant *pVVar6;
  Variant *pVVar7;
  CompilerError *pCVar8;
  size_type sVar9;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  uint32_t local_700;
  undefined1 local_668 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [36];
  uint32_t local_604;
  SPIRVariable *local_600;
  SPIRVariable *backing_var;
  string local_5d8 [32];
  undefined1 local_5b8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518 [32];
  spirv_cross local_4f8 [32];
  spirv_cross local_4d8 [32];
  spirv_cross local_4b8 [32];
  spirv_cross local_498 [39];
  allocator local_471;
  string local_470 [38];
  char local_44a;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [38];
  char local_30a;
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  undefined1 local_298 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  samp_args;
  undefined1 local_140 [64];
  uint local_100;
  uint32_t local_fc;
  uint32_t i;
  uint32_t planes;
  MSLConstexprSampler *constexpr_sampler;
  SPIRVariable *var;
  undefined1 local_e0 [4];
  uint32_t var_id;
  TypedID<(spirv_cross::Types)0> local_c0;
  TypedID<(spirv_cross::Types)0> local_bc;
  Variant *local_b8;
  TypedID<(spirv_cross::Types)0> *itr;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *constants;
  SPIRConstant *local_88;
  SPIRConstant *c;
  spirv_cross local_60 [34];
  byte local_3e;
  byte local_3d;
  bool arg_is_dynamic_img_sampler;
  bool is_dynamic_img_sampler;
  __node_base local_30;
  SPIRType *type;
  long lStack_20;
  uint32_t id_local;
  Parameter *arg_local;
  CompilerMSL *this_local;
  string *arg_str;
  
  lStack_20 = CONCAT44(in_register_00000014,id);
  type._3_1_ = 0;
  type._4_4_ = in_ECX;
  arg_local = arg;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  local_30._M_nxt = (_Hash_node_base *)Compiler::expression_type((Compiler *)arg,type._4_4_);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(lStack_20 + 4));
  local_3d = Compiler::has_extended_decoration
                       ((Compiler *)arg,uVar3,SPIRVCrossDecorationDynamicImageSampler);
  local_3e = Compiler::has_extended_decoration
                       ((Compiler *)arg,type._4_4_,SPIRVCrossDecorationDynamicImageSampler);
  if (((local_3d & 1) != 0) && (!(bool)local_3e)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(local_30._M_nxt + 0x1f));
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar3);
    (**(code **)(*(long *)arg + 0x98))(&c,arg,pSVar4,0);
    join<char_const(&)[24],std::__cxx11::string,char_const(&)[3]>
              (local_60,(char (*) [24])"spvDynamicImageSampler<",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
               (char (*) [3])0x4f0c18);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
    ::std::__cxx11::string::~string((string *)&c);
  }
  local_88 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)arg,type._4_4_);
  if (((arg[0x1d9].field_0x12 & 1) != 0) && (local_88 != (SPIRConstant *)0x0)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_88->super_IVariant).field_0xc)
    ;
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar3);
    bVar2 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
    if (!bVar2) {
      join<char_const(&)[2],unsigned_int&,char_const(&)[12]>
                ((spirv_cross *)&constants,(char (*) [2])0x4e3b4c,(uint *)((long)&type + 4),
                 (char (*) [12])"_array_copy");
      ::std::__cxx11::string::operator=((string *)this,(string *)&constants);
      ::std::__cxx11::string::~string((string *)&constants);
      itr = (TypedID<(spirv_cross::Types)0> *)(*(long *)&arg[99].id + 0x2e0);
      pTVar5 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      __last = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_bc,type._4_4_);
      pVVar6 = (Variant *)
               ::std::
               find<spirv_cross::TypedID<(spirv_cross::Types)0>*,spirv_cross::TypedID<(spirv_cross::Types)0>>
                         (pTVar5,__last,&local_bc);
      local_b8 = pVVar6;
      pVVar7 = (Variant *)
               ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      if (pVVar6 == pVVar7) {
        Compiler::force_recompile((Compiler *)arg);
        pTVar5 = itr;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_c0,type._4_4_);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)pTVar5,&local_c0
                  );
      }
      goto LAB_00406738;
    }
  }
  CompilerGLSL::to_func_call_arg_abi_cxx11_((CompilerGLSL *)local_e0,arg,(uint32_t)lStack_20);
  ::std::__cxx11::string::operator+=((string *)this,(string *)local_e0);
  ::std::__cxx11::string::~string((string *)local_e0);
LAB_00406738:
  var._4_4_ = 0;
  constexpr_sampler =
       (MSLConstexprSampler *)
       Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)arg,type._4_4_);
  if ((SPIRVariable *)constexpr_sampler != (SPIRVariable *)0x0) {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&((SPIRVariable *)constexpr_sampler)->basevariable);
  }
  uVar3 = (uint32_t)arg;
  if ((local_3e & 1) == 0) {
    if (var._4_4_ == 0) {
      local_700 = type._4_4_;
    }
    else {
      local_700 = var._4_4_;
    }
    _i = find_constexpr_sampler((CompilerMSL *)arg,local_700);
    if (*(int *)((ID *)(local_30._M_nxt + 1) + 1) == 0x11) {
      local_fc = 1;
      if (((_i != (MSLConstexprSampler *)0x0) && ((_i->ycbcr_conversion_enable & 1U) != 0)) &&
         (local_fc = _i->planes, (*(byte *)(lStack_20 + 0x10) & 1) == 0)) {
        add_spv_func_and_recompile((CompilerMSL *)arg,SPVFuncImplDynamicImageSampler);
      }
      for (local_100 = 1; local_100 < local_fc; local_100 = local_100 + 1) {
        CompilerGLSL::to_func_call_arg_abi_cxx11_((CompilerGLSL *)local_140,arg,(uint32_t)lStack_20)
        ;
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  ((spirv_cross *)(local_140 + 0x20),(char (*) [3])0x4f06f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &arg[0x203].id,&local_100);
        ::std::__cxx11::string::operator+=((string *)this,(string *)(local_140 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_140 + 0x20));
        ::std::__cxx11::string::~string((string *)local_140);
      }
      if (((ImageType *)(local_30._M_nxt + 0x1f))->dim != DimBuffer) {
        to_sampler_expression_abi_cxx11_
                  ((CompilerMSL *)(samp_args.stack_storage.aligned_char + 0xf8),uVar3);
        ::std::operator+(&stack0xfffffffffffffea0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x4f06f8);
        ::std::__cxx11::string::operator+=((string *)this,(string *)&stack0xfffffffffffffea0);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
        ::std::__cxx11::string::~string((string *)(samp_args.stack_storage.aligned_char + 0xf8));
      }
      if ((((local_3d & 1) != 0) && (_i != (MSLConstexprSampler *)0x0)) &&
         ((_i->ycbcr_conversion_enable & 1U) != 0)) {
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298);
        MVar1 = _i->resolution;
        if (MVar1 != MSL_FORMAT_RESOLUTION_444) {
          if (MVar1 == MSL_FORMAT_RESOLUTION_422) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_2b8,"spvFormatResolution::_422",&local_2b9);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_298,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2b8);
            ::std::__cxx11::string::~string(local_2b8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          }
          else {
            if (MVar1 != MSL_FORMAT_RESOLUTION_420) {
              local_30a = '\x01';
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string(local_308,"Invalid format resolution.",&local_309);
              CompilerError::CompilerError(pCVar8,(string *)local_308);
              local_30a = '\0';
              __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_2e0,"spvFormatResolution::_420",&local_2e1);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_298,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2e0);
            ::std::__cxx11::string::~string(local_2e0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
          }
        }
        if (_i->chroma_filter != MSL_SAMPLER_FILTER_NEAREST) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_330,"spvChromaFilter::linear",&local_331);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330
                     );
          ::std::__cxx11::string::~string(local_330);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_331);
        }
        if (_i->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_358,"spvXChromaLocation::midpoint",&local_359);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358
                     );
          ::std::__cxx11::string::~string(local_358);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_359);
        }
        if (_i->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_380,"spvYChromaLocation::midpoint",&local_381);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380
                     );
          ::std::__cxx11::string::~string(local_380);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
        }
        switch(_i->ycbcr_model) {
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_3a8,"spvYCbCrModelConversion::ycbcr_identity",&local_3a9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8
                     );
          ::std::__cxx11::string::~string(local_3a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_3d0,"spvYCbCrModelConversion::ycbcr_bt_709",&local_3d1);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0
                     );
          ::std::__cxx11::string::~string(local_3d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_3f8,"spvYCbCrModelConversion::ycbcr_bt_601",&local_3f9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8
                     );
          ::std::__cxx11::string::~string(local_3f8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_420,"spvYCbCrModelConversion::ycbcr_bt_2020",&local_421);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420
                     );
          ::std::__cxx11::string::~string(local_420);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_421);
          break;
        default:
          local_44a = '\x01';
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_448,"Invalid Y\'CbCr model conversion.",&local_449);
          CompilerError::CompilerError(pCVar8,(string *)local_448);
          local_44a = '\0';
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (_i->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_470,"spvYCbCrRange::itu_narrow",&local_471);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_298,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470
                     );
          ::std::__cxx11::string::~string(local_470);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_471);
        }
        join<char_const(&)[18],unsigned_int_const&,char_const(&)[2]>
                  (local_498,(char (*) [18])"spvComponentBits(",&_i->bpc,(char (*) [2])0x4dff7a);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_298,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
        ::std::__cxx11::string::~string((string *)local_498);
        merge(local_4d8,
              (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_298,", ");
        join<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                  (local_4b8,(char (*) [19])", spvYCbCrSampler(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8,
                   (char (*) [2])0x4dff7a);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_4b8);
        ::std::__cxx11::string::~string((string *)local_4b8);
        ::std::__cxx11::string::~string((string *)local_4d8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_298);
      }
    }
    if ((((local_3d & 1) == 0) || (_i == (MSLConstexprSampler *)0x0)) ||
       ((_i->ycbcr_conversion_enable & 1U) == 0)) {
      if ((((arg[0x1d9].type.id & 0x100) != 0) && ((arg[0x1f5].alias_global_variable & 1U) != 0)) &&
         (bVar2 = Compiler::is_sampled_image_type((Compiler *)arg,(SPIRType *)local_30._M_nxt),
         bVar2)) {
        to_swizzle_expression_abi_cxx11_((CompilerMSL *)local_5b8,uVar3);
        ::std::operator+(local_5b8 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x4f06f8);
        ::std::__cxx11::string::operator+=((string *)this,(string *)(local_5b8 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_5b8 + 0x20));
        ::std::__cxx11::string::~string((string *)local_5b8);
      }
    }
    else {
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_518);
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_538);
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_558);
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_578);
      join<char_const(&)[9],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[16],std::__cxx11::string,char_const(&)[2]>
                (local_4f8,(char (*) [9])", (uint(",local_518,(char (*) [18])") << 24) | (uint(",
                 local_538,(char (*) [18])") << 16) | (uint(",local_558,
                 (char (*) [16])") << 8) | uint(",local_578,(char (*) [2])0x4dff7a);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_4f8);
      ::std::__cxx11::string::~string((string *)local_4f8);
      ::std::__cxx11::string::~string((string *)local_578);
      ::std::__cxx11::string::~string((string *)local_558);
      ::std::__cxx11::string::~string((string *)local_538);
      ::std::__cxx11::string::~string((string *)local_518);
    }
    sVar9 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)(arg + 0x214),(key_type *)((long)&var + 4));
    if (sVar9 != 0) {
      to_buffer_size_expression_abi_cxx11_((CompilerMSL *)&backing_var,uVar3);
      ::std::operator+((char *)local_5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8
                      );
      ::std::__cxx11::string::operator+=((string *)this,local_5d8);
      ::std::__cxx11::string::~string(local_5d8);
      ::std::__cxx11::string::~string((string *)&backing_var);
    }
    if ((local_3d & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)this,")");
    }
  }
  local_600 = Compiler::maybe_get_backing_variable((Compiler *)arg,var._4_4_);
  bVar2 = false;
  if (local_600 != (SPIRVariable *)0x0) {
    local_604 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_600->super_IVariant).self)
    ;
    sVar9 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&arg[0x219].write_count,&local_604);
    bVar2 = sVar9 != 0;
  }
  if (bVar2) {
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_668,uVar3,SUB41(var._4_4_,0));
    ::std::operator+(local_668 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f06f8);
    ::std::operator+(local_628,local_668 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_628);
    ::std::__cxx11::string::~string((string *)local_628);
    ::std::__cxx11::string::~string((string *)(local_668 + 0x20));
    ::std::__cxx11::string::~string((string *)local_668);
  }
  return this;
}

Assistant:

string CompilerMSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str;

	auto &type = expression_type(id);
	bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	// If the argument *itself* is a "dynamic" combined-image sampler, then we can just pass that around.
	bool arg_is_dynamic_img_sampler = has_extended_decoration(id, SPIRVCrossDecorationDynamicImageSampler);
	if (is_dynamic_img_sampler && !arg_is_dynamic_img_sampler)
		arg_str = join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">(");

	auto *c = maybe_get<SPIRConstant>(id);
	if (msl_options.force_native_arrays && c && !get<SPIRType>(c->constant_type).array.empty())
	{
		// If we are passing a constant array directly to a function for some reason,
		// the callee will expect an argument in thread const address space
		// (since we can only bind to arrays with references in MSL).
		// To resolve this, we must emit a copy in this address space.
		// This kind of code gen should be rare enough that performance is not a real concern.
		// Inline the SPIR-V to avoid this kind of suboptimal codegen.
		//
		// We risk calling this inside a continue block (invalid code),
		// so just create a thread local copy in the current function.
		arg_str = join("_", id, "_array_copy");
		auto &constants = current_function->constant_arrays_needed_on_stack;
		auto itr = find(begin(constants), end(constants), ID(id));
		if (itr == end(constants))
		{
			force_recompile();
			constants.push_back(id);
		}
	}
	else
		arg_str += CompilerGLSL::to_func_call_arg(arg, id);

	// Need to check the base variable in case we need to apply a qualified alias.
	uint32_t var_id = 0;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		var_id = var->basevariable;

	if (!arg_is_dynamic_img_sampler)
	{
		auto *constexpr_sampler = find_constexpr_sampler(var_id ? var_id : id);
		if (type.basetype == SPIRType::SampledImage)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				planes = constexpr_sampler->planes;
				// If this parameter isn't aliasing a global, then we need to use
				// the special "dynamic image-sampler" class to pass it--and we need
				// to use it for *every* non-alias parameter, in case a combined
				// image-sampler with a Y'CbCr conversion is passed. Hopefully, this
				// pathological case is so rare that it should never be hit in practice.
				if (!arg.alias_global_variable)
					add_spv_func_and_recompile(SPVFuncImplDynamicImageSampler);
			}
			for (uint32_t i = 1; i < planes; i++)
				arg_str += join(", ", CompilerGLSL::to_func_call_arg(arg, id), plane_name_suffix, i);
			// Manufacture automatic sampler arg if the arg is a SampledImage texture.
			if (type.image.dim != DimBuffer)
				arg_str += ", " + to_sampler_expression(var_id ? var_id : id);

			// Add sampler Y'CbCr conversion info if we have it
			if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				SmallVector<string> samp_args;

				switch (constexpr_sampler->resolution)
				{
				case MSL_FORMAT_RESOLUTION_444:
					// Default
					break;
				case MSL_FORMAT_RESOLUTION_422:
					samp_args.push_back("spvFormatResolution::_422");
					break;
				case MSL_FORMAT_RESOLUTION_420:
					samp_args.push_back("spvFormatResolution::_420");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid format resolution.");
				}

				if (constexpr_sampler->chroma_filter != MSL_SAMPLER_FILTER_NEAREST)
					samp_args.push_back("spvChromaFilter::linear");

				if (constexpr_sampler->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvXChromaLocation::midpoint");
				if (constexpr_sampler->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvYChromaLocation::midpoint");
				switch (constexpr_sampler->ycbcr_model)
				{
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
					// Default
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_identity");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_709");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_601");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_2020");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
				}
				if (constexpr_sampler->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL)
					samp_args.push_back("spvYCbCrRange::itu_narrow");
				samp_args.push_back(join("spvComponentBits(", constexpr_sampler->bpc, ")"));
				arg_str += join(", spvYCbCrSampler(", merge(samp_args), ")");
			}
		}

		if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			arg_str += join(", (uint(", create_swizzle(constexpr_sampler->swizzle[3]), ") << 24) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[2]), ") << 16) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[1]), ") << 8) | uint(",
			                create_swizzle(constexpr_sampler->swizzle[0]), ")");
		else if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(type))
			arg_str += ", " + to_swizzle_expression(var_id ? var_id : id);

		if (buffers_requiring_array_length.count(var_id))
			arg_str += ", " + to_buffer_size_expression(var_id ? var_id : id);

		if (is_dynamic_img_sampler)
			arg_str += ")";
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(var_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		arg_str += ", " + to_expression(var_id) + "_atomic";
	}

	return arg_str;
}